

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O1

void __thiscall Sequence::process_itemset(Sequence *this,Itemset_S *iset,uint templ,int iter)

{
  int *piVar1;
  element_type *peVar2;
  EqGrNode *pEVar3;
  element_type *peVar4;
  pointer piVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  int iVar8;
  undefined4 in_register_0000000c;
  int iVar9;
  uint ptempl;
  element_type *peVar10;
  Itemset_S ljoin;
  Itemset_S ejoin;
  Env *local_a8;
  element_type *peStack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  int local_8c;
  Itemset_S iset2;
  int esup;
  int lsup;
  Env *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Itemset_S local_50;
  Itemset_S local_40;
  
  local_98._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000000c,iter);
  peVar2 = (this->numLargeItemset).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((ulong)(long)iter <=
      (ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    local_60 = this->env;
    iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar7 = Itemset::operator[]((iset->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr,0);
    peVar10 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar9 = (int)local_98._M_pi;
    if (peVar10->maxiter < iVar9) {
      peVar10->maxiter = iVar9;
    }
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)iVar7 * 0x10);
    if (*(long *)((long)&(local_58._M_pi)->_vptr__Sp_counted_base +
                 (long)(((this->invdb).
                         super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       eqgraph).
                       super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) != 0) {
      iVar7 = iVar9 + -1;
      local_8c = iVar9 + 1;
      iVar9 = 0;
      do {
        pEVar3 = *(EqGrNode **)
                  ((long)&(local_58._M_pi)->_vptr__Sp_counted_base +
                  (long)(((this->invdb).
                          super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        eqgraph).
                        super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        peVar4 = (pEVar3->theElements).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar8 = 0;
        if (peVar4 != (element_type *)0x0) {
          iVar8 = peVar4->theSize;
        }
        if (iVar8 <= iVar9) {
          ptempl = templ | 1 << ((int)local_98._M_pi - 2U & 0x1f);
          iVar9 = 0;
          goto LAB_0010b64f;
        }
        EqGrNode::get_element(pEVar3,iVar9);
        InvertDatabase::get_item
                  ((InvertDatabase *)&local_a8,
                   (int)(this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        _Var6 = iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0;
        iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a8;
        local_a8 = (Env *)0x0;
        peStack_a0 = (element_type *)0x0;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if (peStack_a0 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
        }
        _Var6._M_pi = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        prune_decision((Sequence *)&local_a8,(Itemset_S *)this,&iset2,(uint)iset,templ);
        peVar10 = peStack_a0;
        ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a8;
        _Var6 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_a8 = (Env *)0x0;
        peStack_a0 = (element_type *)0x0;
        ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        peVar10 = peStack_a0;
        if (peStack_a0 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
        }
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          peVar10 = (element_type *)this;
          pre_pruning(this,&ejoin,templ,iset,&iset2,'\0');
        }
        if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          peVar10 = (element_type *)this;
          get_tmpnewf_intersect
                    (this,&ljoin,&ejoin,&ljoin,&lsup,&esup,&lsup,&iset2,iset,(int)local_98._M_pi);
        }
        if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          fill_join((Sequence *)peVar10,&ejoin,iset,&iset2);
        }
        if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pruning_type) {
          post_pruning(this,&ejoin,templ);
        }
        if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          peVar2 = (this->numLargeItemset).
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          piVar5 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <=
              (ulong)(long)iVar7) goto LAB_0010b89a;
          piVar1 = piVar5 + iVar7;
          *piVar1 = *piVar1 + 1;
          if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              outputfreq != '\0') {
            Itemset::print_seq(ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               (ostream *)local_60,templ);
          }
          local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          process_itemset(this,&local_40,templ,local_8c);
          if ((element_type *)
              local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          _Var6._M_pi = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
          ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
          ;
          ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
          }
        }
        iVar9 = iVar9 + 1;
      } while( true );
    }
LAB_0010b85b:
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  return;
LAB_0010b64f:
  pEVar3 = *(EqGrNode **)
            ((long)&(local_58._M_pi)->_vptr__Sp_counted_base +
            (long)(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->eqgraph).
                  super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  peVar4 = (pEVar3->stheElements).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = 0;
  if (peVar4 != (element_type *)0x0) {
    iVar8 = peVar4->theSize;
  }
  if (iVar8 <= iVar9) goto LAB_0010b85b;
  EqGrNode::seqget_element(pEVar3,iVar9);
  InvertDatabase::get_item
            ((InvertDatabase *)&local_a8,
             (int)(this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  _Var6 = iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0;
  iset2.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_a8;
  local_a8 = (Env *)0x0;
  peStack_a0 = (element_type *)0x0;
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  if (peStack_a0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
  }
  _Var6._M_pi = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  prune_decision((Sequence *)&local_a8,(Itemset_S *)this,&iset2,(uint)iset,ptempl);
  peVar10 = peStack_a0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_a8;
  _Var6 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_a8 = (Env *)0x0;
  peStack_a0 = (element_type *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  peVar10 = peStack_a0;
  if (peStack_a0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
  }
  if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pruning_type) {
    peVar10 = (element_type *)this;
    pre_pruning(this,&ljoin,ptempl,iset,&iset2,'\x01');
  }
  if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    peVar10 = (element_type *)this;
    get_tmpnewf_intersect
              (this,&ljoin,&ejoin,&ejoin,&lsup,&esup,&esup,&iset2,iset,(int)local_98._M_pi);
  }
  if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    fill_join((Sequence *)peVar10,&ljoin,iset,&iset2);
  }
  if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pruning_type) {
    post_pruning(this,&ljoin,ptempl);
  }
  if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    peVar2 = (this->numLargeItemset).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    piVar5 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= (ulong)(long)iVar7)
    {
LAB_0010b89a:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                 (long)iVar7);
    }
    piVar1 = piVar5 + iVar7;
    *piVar1 = *piVar1 + 1;
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        outputfreq != '\0') {
      Itemset::print_seq(ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ostream *)local_60,ptempl);
    }
    local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    process_itemset(this,&local_50,ptempl,local_8c);
    if (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    _Var6._M_pi = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
    }
  }
  iVar9 = iVar9 + 1;
  goto LAB_0010b64f;
}

Assistant:

void Sequence::process_itemset(Itemset_S iset, unsigned int templ, int iter) {
    if (iter > numLargeItemset->size()) return;

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int i, it2;
    int lsup, esup;
    unsigned int ntpl;
    Itemset_S iset2, ejoin, ljoin;
    int it = (*iset)[0];
    if (args->maxiter < iter) args->maxiter = iter;
    if (invdb->get_eqgraph_item(it)) {
        for (i = 0; i < invdb->get_eqgraph_item(it)->num_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->get_element(i);
            ntpl = templ;
            iset2 = invdb->get_item(it2);
            ljoin = nullptr;
            ejoin = prune_decision(iset2, iset, ntpl, EJOIN);
            if (args->pruning_type > 1) pre_pruning(ejoin, ntpl, iset, iset2, 0);
            if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, ljoin, lsup, esup, lsup, iset2, iset, iter);
            if (ejoin) fill_join(ejoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ejoin, ntpl);
            if (ejoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ejoin, iset, iset2);
                //if (iter > 3) ejoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ejoin->print_seq(seqstrm, ntpl);
                process_itemset(ejoin, ntpl, iter + 1);
                ejoin = nullptr;
            }
        }

        for (i = 0; i < invdb->get_eqgraph_item(it)->seqnum_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->seqget_element(i);
            ntpl = SETBIT(templ, 1, iter - 2);
            iset2 = invdb->get_item(it2);
            ejoin = nullptr;
            ljoin = prune_decision(iset2, iset, ntpl, LJOIN);
            if (args->pruning_type > 1) pre_pruning(ljoin, ntpl, iset, iset2, 1);
            if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, ejoin, lsup, esup, esup, iset2, iset, iter);
            if (ljoin) fill_join(ljoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ljoin, ntpl);
            if (ljoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ljoin, iset, iset2);
                //if (iter > 3) ljoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ljoin->print_seq(seqstrm, ntpl);
                process_itemset(ljoin, ntpl, iter + 1);
                ljoin = nullptr;
            }
        }
    }
}